

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

void __thiscall merlin::factor::factor(factor *this,variable_set *vs,value s)

{
  size_t __new_size;
  value s_local;
  variable_set *vs_local;
  factor *this_local;
  
  this->_vptr_factor = (_func_int **)&PTR__factor_002973f8;
  variable_set::variable_set(&this->v_,vs);
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(&this->t_);
  this->c_ = -1;
  __new_size = variable_set::num_states(vs);
  std::vector<double,_std::allocator<double>_>::resize(&this->t_,__new_size);
  set_dims(this);
  fill(this,s);
  return;
}

Assistant:

factor(variable_set const& vs, value s = 1.0) : v_(vs), t_(), c_(-1) {
		t_.resize(vs.num_states());
		set_dims();
		fill(s);
	}